

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O1

void __thiscall wasm::RemoveUnusedNames::handleBreakTarget(RemoveUnusedNames *this,Name *name)

{
  map<wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  *this_00;
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  pVar2;
  
  if ((name->super_IString).str._M_str != (char *)0x0) {
    this_00 = &this->branchesSeen;
    iVar1 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
            ::find(&this_00->_M_t,name);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->branchesSeen)._M_t._M_impl.super__Rb_tree_header
       ) {
      pVar2 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
              ::equal_range(&this_00->_M_t,name);
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
      return;
    }
    (name->super_IString).str._M_len = 0;
    (name->super_IString).str._M_str = (char *)0x0;
  }
  return;
}

Assistant:

void handleBreakTarget(Name& name) {
    if (name.is()) {
      if (branchesSeen.find(name) == branchesSeen.end()) {
        name = Name();
      } else {
        branchesSeen.erase(name);
      }
    }
  }